

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall
glu::Texture2DArray::loadCompressed
          (Texture2DArray *this,int numLevels,CompressedTexture *levels,
          TexDecompressionParams *decompressionParams)

{
  code *pcVar1;
  int iVar2;
  CompressedTexFormat format;
  deUint32 dVar3;
  deBool dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  TestError *pTVar9;
  PixelBufferAccess *pPVar10;
  ConstPixelBufferAccess *this_00;
  void *pvVar11;
  undefined1 local_80 [8];
  PixelBufferAccess refLevelAccess;
  CompressedTexture *level;
  int levelNdx;
  deUint32 compressedFormat;
  Functions *gl;
  TexDecompressionParams *decompressionParams_local;
  CompressedTexture *levels_local;
  int numLevels_local;
  Texture2DArray *this_local;
  long lVar8;
  
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar2);
  format = tcu::CompressedTexture::getFormat(levels);
  dVar3 = getGLFormat(format);
  do {
    dVar4 = ::deGetFalse();
    if ((dVar4 != 0) || (this->m_glTexture == 0)) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,(char *)0x0,"m_glTexture",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x26c);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  (**(code **)(lVar8 + 0xb8))(0x8c1a,this->m_glTexture);
  level._0_4_ = 0;
  do {
    if (numLevels <= (int)level) {
      dVar3 = (**(code **)(lVar8 + 0x800))();
      checkError(dVar3,"Texture upload failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x280);
      return;
    }
    refLevelAccess.super_ConstPixelBufferAccess.m_data = levels + (int)level;
    tcu::Texture2DArray::allocLevel(&this->m_refTexture,(int)level);
    pPVar10 = tcu::TextureLevelPyramid::getLevel
                        (&(this->m_refTexture).super_TextureLevelPyramid,(int)level);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_80,pPVar10);
    do {
      dVar4 = ::deGetFalse();
      if (dVar4 != 0) {
LAB_01213b25:
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,(char *)0x0,
                   "level.getWidth() == refLevelAccess.getWidth() && level.getHeight() == refLevelAccess.getHeight() && level.getDepth() == refLevelAccess.getDepth()"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                   ,0x278);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      iVar2 = tcu::CompressedTexture::getWidth
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
      iVar5 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_80);
      if (iVar2 != iVar5) goto LAB_01213b25;
      iVar2 = tcu::CompressedTexture::getHeight
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
      iVar5 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_80);
      if (iVar2 != iVar5) goto LAB_01213b25;
      iVar2 = tcu::CompressedTexture::getDepth
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
      iVar5 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_80);
      if (iVar2 != iVar5) goto LAB_01213b25;
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    tcu::CompressedTexture::decompress
              ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data,
               (PixelBufferAccess *)local_80,decompressionParams);
    pcVar1 = *(code **)(lVar8 + 0x290);
    iVar2 = tcu::CompressedTexture::getWidth
                      ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
    iVar5 = tcu::CompressedTexture::getHeight
                      ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
    this_00 = &tcu::TextureLevelPyramid::getLevel
                         (&(this->m_refTexture).super_TextureLevelPyramid,(int)level)->
               super_ConstPixelBufferAccess;
    iVar6 = tcu::ConstPixelBufferAccess::getDepth(this_00);
    iVar7 = tcu::CompressedTexture::getDataSize
                      ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
    pvVar11 = tcu::CompressedTexture::getData
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
    (*pcVar1)(0x8c1a,(int)level,dVar3,iVar2,iVar5,iVar6,0,iVar7,pvVar11);
    level._0_4_ = (int)level + 1;
  } while( true );
}

Assistant:

void Texture2DArray::loadCompressed (int numLevels, const tcu::CompressedTexture* levels, const tcu::TexDecompressionParams& decompressionParams)
{
	const glw::Functions&	gl					= m_context.getFunctions();
	deUint32				compressedFormat	= getGLFormat(levels[0].getFormat());

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_glTexture);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const tcu::CompressedTexture& level = levels[levelNdx];

		// Decompress to reference texture.
		m_refTexture.allocLevel(levelNdx);
		tcu::PixelBufferAccess refLevelAccess = m_refTexture.getLevel(levelNdx);
		TCU_CHECK(level.getWidth()	== refLevelAccess.getWidth() &&
				  level.getHeight()	== refLevelAccess.getHeight() &&
				  level.getDepth()	== refLevelAccess.getDepth());
		level.decompress(refLevelAccess, decompressionParams);

		// Upload to GL texture in compressed form.
		gl.compressedTexImage3D(GL_TEXTURE_2D_ARRAY, levelNdx, compressedFormat,
								level.getWidth(), level.getHeight(), m_refTexture.getLevel(levelNdx).getDepth(), 0 /* border */, level.getDataSize(), level.getData());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}